

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall ON_Material::RemoveColorAlphaValues(ON_Material *this)

{
  uint uVar1;
  undefined8 in_RAX;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_14;
  
  local_14.m_color = (uint)((ulong)in_RAX >> 0x20);
  uVar1 = OnlyRGB(&this->m_ambient);
  ON_Color::ON_Color((ON_Color *)&local_14,uVar1);
  (this->m_ambient).field_0.m_color = (uint)local_14;
  uVar1 = OnlyRGB(&this->m_diffuse);
  ON_Color::ON_Color((ON_Color *)&local_14,uVar1);
  (this->m_diffuse).field_0.m_color = (uint)local_14;
  uVar1 = OnlyRGB(&this->m_emission);
  ON_Color::ON_Color((ON_Color *)&local_14,uVar1);
  (this->m_emission).field_0 = local_14;
  uVar1 = OnlyRGB(&this->m_specular);
  ON_Color::ON_Color((ON_Color *)&local_14,uVar1);
  (this->m_specular).field_0 = local_14;
  uVar1 = OnlyRGB(&this->m_reflection);
  ON_Color::ON_Color((ON_Color *)&local_14,uVar1);
  (this->m_reflection).field_0 = local_14;
  uVar1 = OnlyRGB(&this->m_transparent);
  ON_Color::ON_Color((ON_Color *)&local_14,uVar1);
  (this->m_transparent).field_0 = local_14;
  return;
}

Assistant:

void ON_Material::RemoveColorAlphaValues(void)
{
  m_ambient = OnlyRGB(m_ambient);
  m_diffuse = OnlyRGB(m_diffuse);
  m_emission = OnlyRGB(m_emission);
  m_specular = OnlyRGB(m_specular);
  m_reflection = OnlyRGB(m_reflection);
  m_transparent = OnlyRGB(m_transparent);
  
}